

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layers_switch_Dyy_unconditional_opt_order(fasthessian *fh)

{
  int iVar1;
  integral_image *iimage_00;
  undefined8 *in_RDI;
  int image_size;
  integral_image *iimage;
  response_layer *layer;
  int n;
  int i;
  integral_image *in_stack_00000108;
  response_layer *in_stack_00000110;
  integral_image *in_stack_000001f8;
  response_layer *in_stack_00000200;
  int local_c;
  
  local_c = 0;
  iVar1 = *(int *)(in_RDI + 10);
  iimage_00 = (integral_image *)*in_RDI;
  if (iimage_00->height == 0x20) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    height_greater_border_width_greater_double_lobe_Dyy_inlined
              ((response_layer *)in_RDI[5],iimage_00);
    height_greater_border_width_less_double_lobe_Dyy_inlined((response_layer *)in_RDI[6],iimage_00);
    image_32_filter_75_case((response_layer *)in_RDI[7],iimage_00);
    image_32_filter_99_case(in_stack_00000110,in_stack_00000108);
  }
  else if (iimage_00->height == 0x40) {
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
              (in_stack_00000200,in_stack_000001f8);
    height_greater_border_width_greater_double_lobe_Dyy_inlined
              ((response_layer *)in_RDI[7],iimage_00);
    height_greater_border_width_less_double_lobe_Dyy_inlined((response_layer *)in_RDI[8],iimage_00);
  }
  else {
    for (; local_c < iVar1; local_c = local_c + 1) {
      compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined
                (in_stack_00000200,in_stack_000001f8);
    }
  }
  return;
}

Assistant:

void compute_response_layers_switch_Dyy_unconditional_opt_order(struct fasthessian *fh) {
    /*
        base function: compute_response_layer_switch_Dyy_unconditional_opt

        optimization:
        - hardcoded order for image sizes

        notes:
        - intended to check if our corner case optimizations are more optimal or not
        - optimize if statement for a better order, very similar to
            compute_response_layer_switch_Dyy_unconditional_opt_naive,
            just all cases are hardcoded
    */
    int i = 0;
    int n = fh->total_layers;

    struct response_layer *layer;
    struct integral_image *iimage = fh->iimage;

    int image_size = iimage->height;

    if (image_size == 32) {

        // filter 9, 15, 21, 27
        layer = fh->response_map[0];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[1];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[2];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[3];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        // filter 39
        layer = fh->response_map[4];
        height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);

        // filter 51
        layer = fh->response_map[5];
        height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);

        // filter 75
        layer = fh->response_map[6];
        image_32_filter_75_case(layer, iimage);

        // filter 99
        layer = fh->response_map[7];
        image_32_filter_99_case(layer, iimage);

    } else if (image_size == 64) {

        // filter 9, 15, 21, 27, 39, 51
        layer = fh->response_map[0];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[1];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[2];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[3];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[4];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        layer = fh->response_map[5];
        compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);

        // filter 75
        layer = fh->response_map[6];
        height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);

        // filter 99
        layer = fh->response_map[7];
        height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);

    } else {

        // all other cases
        for (; i < n; ++i) {
            layer = fh->response_map[i];

            compute_response_layer_Dyy_laplacian_locality_unconditional_opt_flops_inlined(layer, iimage);
        }
    }

}